

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

QIcon __thiscall QFusionStyle::iconFromTheme(QFusionStyle *this,StandardPixmap standardIcon)

{
  QIcon *icon_00;
  QStringView *this_00;
  char16_t *pcVar1;
  undefined4 in_EDX;
  QIconPrivate *in_RDI;
  long in_FS_OFFSET;
  QStringView in_stack_00000030;
  QIcon *icon;
  size_t RuntimeThreshold;
  size_t i;
  size_t RuntimeThreshold_1;
  size_t i_1;
  size_t RuntimeThreshold_2;
  size_t i_2;
  anon_class_1_0_00000001 addIconFiles;
  qsizetype in_stack_fffffffffffffec0;
  char16_t *in_stack_fffffffffffffec8;
  QStringView *in_stack_fffffffffffffed0;
  QIcon *in_stack_fffffffffffffee0;
  QIconPrivate *this_01;
  ulong local_a8;
  ulong local_80;
  ulong local_58;
  char16_t local_30 [19];
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QIcon::QIcon((QIcon *)in_RDI);
  local_9 = 0xaa;
  switch(in_EDX) {
  case 1:
    pcVar1 = local_30;
    this_00 = (QStringView *)
              std::data<char16_t_const,21ul>((char16_t (*) [21])L"fusion_titlebar-min-");
    for (local_80 = 0; (local_80 < 0x15 && (L"fusion_titlebar-min-"[local_80] != L'\0'));
        local_80 = local_80 + 1) {
    }
    QStringView::QStringView<char16_t,_true>(this_00,pcVar1,in_stack_fffffffffffffec0);
    iconFromTheme::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)this_01,in_stack_00000030,in_stack_fffffffffffffee0);
    break;
  default:
    break;
  case 3:
  case 8:
    pcVar1 = std::data<char16_t_const,18ul>((char16_t (*) [18])L"fusion_closedock-");
    for (local_58 = 0; (local_58 < 0x12 && (L"fusion_closedock-"[local_58] != L'\0'));
        local_58 = local_58 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(qsizetype)pcVar1);
    iconFromTheme::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)this_01,in_stack_00000030,in_stack_fffffffffffffee0);
    break;
  case 4:
    icon_00 = (QIcon *)std::data<char16_t_const,24ul>((char16_t (*) [24])L"fusion_normalizedockup-")
    ;
    for (local_a8 = 0; (local_a8 < 0x18 && (L"fusion_normalizedockup-"[local_a8] != L'\0'));
        local_a8 = local_a8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    iconFromTheme::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)this_01,in_stack_00000030,icon_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QIcon)in_RDI;
}

Assistant:

QIcon QFusionStyle::iconFromTheme(StandardPixmap standardIcon) const
{
    QIcon icon;
#if QT_CONFIG(imageformat_png)
    auto addIconFiles = [](QStringView prefix, QIcon &icon)
    {
        const auto fullPrefix = QStringLiteral(":/qt-project.org/styles/fusionstyle/images/") + prefix;
        static constexpr auto dockTitleIconSizes = {10, 16, 20, 32, 48, 64};
        for (int size : dockTitleIconSizes)
            icon.addFile(fullPrefix + QString::number(size) + QStringLiteral(".png"),
                         QSize(size, size));
    };
    switch (standardIcon) {
    case SP_TitleBarNormalButton:
        addIconFiles(u"fusion_normalizedockup-", icon);
      break;
    case SP_TitleBarMinButton:
        addIconFiles(u"fusion_titlebar-min-", icon);
        break;
    case SP_TitleBarCloseButton:
    case SP_DockWidgetCloseButton:
        addIconFiles(u"fusion_closedock-", icon);
        break;
    default:
        break;
    }
#else  // imageformat_png
    Q_UNUSED(standardIcon);
#endif // imageformat_png
    return icon;
}